

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O0

string * __thiscall
wabt::(anonymous_namespace)::MakeDollarName_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,string_view name)

{
  string local_78;
  allocator local_41;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  undefined1 local_20 [8];
  string_view name_local;
  
  name_local.data_ = name.data_;
  local_20 = (undefined1  [8])this;
  name_local.size_ = (size_type)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40,"$",&local_41);
  string_view::to_string_abi_cxx11_(&local_78,(string_view *)local_20);
  std::operator+(__return_storage_ptr__,&local_40,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  return __return_storage_ptr__;
}

Assistant:

static std::string MakeDollarName(string_view name) {
  return std::string("$") + name.to_string();
}